

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O3

void __thiscall Tank::validate(Tank *this,Network *nw)

{
  Curve *pCVar1;
  double *pdVar2;
  double *pdVar3;
  pointer pcVar4;
  NetworkError *pNVar5;
  ulong uVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  string local_88;
  string local_68;
  string local_48;
  
  pCVar1 = this->volCurve;
  if (pCVar1 == (Curve *)0x0 && this->diameter == 0.0) {
    pNVar5 = (NetworkError *)__cxa_allocate_exception(0x30);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    pcVar4 = (this->super_Node).super_Element.name._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar4,
               pcVar4 + (this->super_Node).super_Element.name._M_string_length);
    NetworkError::NetworkError(pNVar5,7,&local_88);
    __cxa_throw(pNVar5,&NetworkError::typeinfo,ENerror::~ENerror);
  }
  if (pCVar1 == (Curve *)0x0) {
    dVar8 = this->minHead;
    dVar9 = this->maxHead;
LAB_0012ef14:
    if (dVar9 < dVar8) {
      pNVar5 = (NetworkError *)__cxa_allocate_exception(0x30,nw);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      pcVar4 = (this->super_Node).super_Element.name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar4,
                 pcVar4 + (this->super_Node).super_Element.name._M_string_length);
      NetworkError::NetworkError(pNVar5,3,&local_48);
      __cxa_throw(pNVar5,&NetworkError::typeinfo,ENerror::~ENerror);
    }
    if (dVar8 <= this->initHead) {
      dVar8 = this->initHead;
    }
    if (dVar8 <= dVar9) {
      dVar9 = dVar8;
    }
    this->initHead = dVar9;
    return;
  }
  pdVar2 = (pCVar1->xData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (pCVar1->xData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = (long)pdVar3 - (long)pdVar2;
  iVar7 = (int)(uVar6 >> 3);
  if (iVar7 < 2) {
    pNVar5 = (NetworkError *)__cxa_allocate_exception(0x30);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    pcVar4 = (this->super_Node).super_Element.name._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar4,
               pcVar4 + (this->super_Node).super_Element.name._M_string_length);
    NetworkError::NetworkError(pNVar5,7,&local_68);
    __cxa_throw(pNVar5,&NetworkError::typeinfo,ENerror::~ENerror);
  }
  if (pdVar3 == pdVar2) {
    nw = (Network *)0x0;
  }
  else {
    dVar9 = (this->super_Node).elev;
    dVar8 = *pdVar2 / this->ucfLength + dVar9;
    if (dVar8 <= this->minHead) {
      dVar8 = this->minHead;
    }
    this->minHead = dVar8;
    nw = (Network *)(ulong)(iVar7 - 1);
    if (nw < (Network *)((long)uVar6 >> 3)) {
      dVar9 = dVar9 + pdVar2[(long)nw] / this->ucfLength;
      if (this->maxHead <= dVar9) {
        dVar9 = this->maxHead;
      }
      this->maxHead = dVar9;
      goto LAB_0012ef14;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",nw);
}

Assistant:

void Tank::validate(Network* nw)
{
    // ... check for enough info to compute volume
    if ( diameter == 0.0 && volCurve == nullptr )
    {
        throw NetworkError(NetworkError::INVALID_VOLUME_CURVE, name);
    }

    // ... check that volume curve (depth v. volume in user units)
    //     covers range of depth limits
    if ( volCurve )
    {
        if ( volCurve->size() < 2 )
        {
            throw NetworkError(NetworkError::INVALID_VOLUME_CURVE, name);
        }
        double tankHead = volCurve->x(0) / ucfLength + elev;
        minHead = max(minHead, tankHead);
        tankHead = volCurve->x(volCurve->size() - 1) / ucfLength + elev;
        maxHead = min(maxHead, tankHead);
     }

    // ... check for consistent depth limits
    if ( maxHead < minHead )
    {
        throw NetworkError(NetworkError::INVALID_TANK_LEVELS, name);
    }
    initHead = max(initHead, minHead);
    initHead = min(initHead, maxHead);
}